

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_process_quic_post_handshake(SSL *ssl)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  undefined1 local_40 [8];
  SSLMessage msg;
  SSL *ssl_local;
  
  msg.raw.len = (size_t)ssl;
  bssl::ssl_reset_error_state(ssl);
  iVar2 = SSL_is_quic((SSL *)msg.raw.len);
  if ((iVar2 == 0) || (iVar2 = SSL_in_init((SSL *)msg.raw.len), iVar2 != 0)) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0x326);
    ssl_local._4_4_ = 0;
  }
  else {
    bVar1 = bssl::check_read_error((SSL *)msg.raw.len);
    if (bVar1) {
      while (uVar3 = (**(code **)(*(long *)msg.raw.len + 0x18))(msg.raw.len,local_40),
            (uVar3 & 1) != 0) {
        iVar2 = ssl_do_post_handshake((SSL *)msg.raw.len,(SSLMessage *)local_40);
        if (iVar2 == 0) {
          bssl::ssl_set_read_error((SSL *)msg.raw.len);
          return 0;
        }
        (**(code **)(*(long *)msg.raw.len + 0x20))(msg.raw.len);
      }
      ssl_local._4_4_ = 1;
    }
    else {
      ssl_local._4_4_ = 0;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_process_quic_post_handshake(SSL *ssl) {
  ssl_reset_error_state(ssl);

  if (!SSL_is_quic(ssl) || SSL_in_init(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  // Replay post-handshake message errors.
  if (!check_read_error(ssl)) {
    return 0;
  }

  // Process any buffered post-handshake messages.
  SSLMessage msg;
  while (ssl->method->get_message(ssl, &msg)) {
    // Handle the post-handshake message and try again.
    if (!ssl_do_post_handshake(ssl, msg)) {
      ssl_set_read_error(ssl);
      return 0;
    }
    ssl->method->next_message(ssl);
  }

  return 1;
}